

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_tests.cpp
# Opt level: O0

void __thiscall span_tests::span_constructor_sfinae::test_method(span_constructor_sfinae *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffa28;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  assertion_result *in_stack_fffffffffffffa38;
  assertion_result *this_00;
  lazy_ostream *in_stack_fffffffffffffa50;
  size_t in_stack_fffffffffffffa58;
  assertion_result *line_num;
  const_string *in_stack_fffffffffffffa60;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffa68;
  unit_test_log_t *this_01;
  const_string local_480 [2];
  lazy_ostream local_460 [2];
  assertion_result local_438 [2];
  const_string local_400 [2];
  lazy_ostream local_3e0 [2];
  assertion_result local_3b8;
  unit_test_log_t local_3a0 [2];
  const_string local_390;
  const_string local_380 [2];
  lazy_ostream local_360 [2];
  assertion_result local_340 [2];
  const_string local_308 [2];
  lazy_ostream local_2e8 [3];
  assertion_result local_2b8 [2];
  const_string local_280 [2];
  lazy_ostream local_260 [2];
  assertion_result local_240 [2];
  const_string local_208 [2];
  lazy_ostream local_1e8 [2];
  assertion_result local_1c0 [2];
  const_string local_188 [2];
  lazy_ostream local_168 [2];
  assertion_result local_140 [2];
  const_string local_108 [2];
  lazy_ostream local_e8 [2];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  assertion_result local_b0 [2];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
               (const_string *)in_stack_fffffffffffffa50);
    local_c8 = 0;
    uStack_c0 = 0;
    local_b8 = 0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa28);
    anon_unknown.dwarf_c10f08::Spannable<std::vector<int,_std::allocator<int>_>_>
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa28,(Span<int> *)0xaf73d8)
    ;
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b0,local_e8,local_108,0x3f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa38);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
               (const_string *)in_stack_fffffffffffffa50);
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffa28);
    ::(anonymous_namespace)::Ignore::Ignore<std::set<int,std::less<int>,std::allocator<int>>>
              ((Ignore *)in_stack_fffffffffffffa28,
               (set<int,_std::less<int>,_std::allocator<int>_> *)0xaf757d);
    anon_unknown.dwarf_c10f08::Spannable();
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_140,local_168,local_188,0x40,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffa28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
               (const_string *)in_stack_fffffffffffffa50);
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_58 = 0;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffa28);
    ::(anonymous_namespace)::Ignore::Ignore<std::vector<bool,std::allocator<bool>>>
              ((Ignore *)in_stack_fffffffffffffa28,(vector<bool,_std::allocator<bool>_> *)0xaf772f);
    anon_unknown.dwarf_c10f08::Spannable();
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c0,local_1e8,local_208,0x41,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffa28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
               (const_string *)in_stack_fffffffffffffa50);
    local_40 = 0;
    local_48 = 0;
    anon_unknown.dwarf_c10f08::Spannable<std::array<int,_3UL>_>
              ((array<int,_3UL> *)in_stack_fffffffffffffa28,(Span<int> *)0xaf78c0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_240,local_260,local_280,0x42,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
               (const_string *)in_stack_fffffffffffffa50);
    Span<int>::Span((Span<int> *)in_stack_fffffffffffffa28);
    anon_unknown.dwarf_c10f08::Spannable<Span<int>_>
              ((Span<int> *)in_stack_fffffffffffffa28,(Span<int> *)0xaf7a18);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2b8,local_2e8,local_308,0x43,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
               (const_string *)in_stack_fffffffffffffa50);
    anon_unknown.dwarf_c10f08::Spannable<const_char_(&)[11]>
              ((char (*) [11])in_stack_fffffffffffffa28,(Span<const_char> *)0xaf7b54);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_340,local_360,local_380,0x44,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = &local_390;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    this_01 = local_3a0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,file,(size_t)line_num,(const_string *)in_stack_fffffffffffffa50);
    anon_unknown.dwarf_c10f08::Spannable<(anonymous_namespace)::SpannableYes>
              ((SpannableYes *)in_stack_fffffffffffffa28,(Span<int> *)0xaf7c8b);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffa38,(bool)in_stack_fffffffffffffa37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa38,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_3b8,local_3e0,local_400,0x45,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)boost::unit_test::(anonymous_namespace)::unit_test_log,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,file,(size_t)line_num,(const_string *)in_stack_fffffffffffffa50);
    anon_unknown.dwarf_c10f08::Ignore::Ignore<(anonymous_namespace)::SpannableNo>
              ((Ignore *)in_stack_fffffffffffffa28,(SpannableNo *)0xaf7dc6);
    anon_unknown.dwarf_c10f08::Spannable();
    boost::test_tools::assertion_result::assertion_result(this_00,(bool)in_stack_fffffffffffffa37);
    in_stack_fffffffffffffa50 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               (unsigned_long)in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_438,local_460,local_480,0x46,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(span_constructor_sfinae)
{
    BOOST_CHECK(Spannable(std::vector<int>{}));
    BOOST_CHECK(!Spannable(std::set<int>{}));
    BOOST_CHECK(!Spannable(std::vector<bool>{}));
    BOOST_CHECK(Spannable(std::array<int, 3>{}));
    BOOST_CHECK(Spannable(Span<int>{}));
    BOOST_CHECK(Spannable("char array"));
    BOOST_CHECK(Spannable(SpannableYes{}));
    BOOST_CHECK(!Spannable(SpannableNo{}));
}